

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

int Nwk_ManGraphListLength(Nwk_Grf_t *p,int List)

{
  int iVar1;
  Nwk_Vrt_t *pNVar2;
  
  iVar1 = 0;
  if (List == 0) {
    pNVar2 = (Nwk_Vrt_t *)0x0;
  }
  else {
    pNVar2 = p->pVerts[List];
  }
  if (pNVar2 != (Nwk_Vrt_t *)0x0) {
    iVar1 = 0;
    do {
      if ((long)pNVar2->iNext == 0) {
        pNVar2 = (Nwk_Vrt_t *)0x0;
      }
      else {
        pNVar2 = p->pVerts[pNVar2->iNext];
      }
      iVar1 = iVar1 + 1;
    } while (pNVar2 != (Nwk_Vrt_t *)0x0);
  }
  return iVar1;
}

Assistant:

int Nwk_ManGraphListLength( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis;
    int fVerbose = 0;
    int Counter = 0;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        if ( fVerbose && Counter < 20 )
            printf( "%d ", p->pVerts[pThis->pEdges[0]]->nEdges );
        Counter++;
    }
    if ( fVerbose )
        printf( "\n" );
    return Counter;
}